

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesImageSparseResidency.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::sparse::anon_unknown_4::ImageSparseResidencyInstance::iterate
          (TestStatus *__return_storage_ptr__,ImageSparseResidencyInstance *this)

{
  VkDevice pVVar1;
  ProgramCollection<vk::ProgramBinary> *this_00;
  VkImageSubresourceRange subresourceRange;
  VkImageSubresourceRange subresourceRange_00;
  VkImageSubresourceRange subresourceRange_01;
  undefined8 uVar2;
  Handle<(vk::HandleType)9> image;
  bool bVar3;
  deUint32 dVar4;
  deUint32 dVar5;
  VkImageViewType imageViewType;
  VkFormat format;
  deUint32 dVar6;
  uint uVar7;
  VkResult result;
  InstanceInterface *vk;
  VkPhysicalDevice physicalDevice;
  Queue *pQVar8;
  Queue *pQVar9;
  DescriptorSetLayoutBuilder *this_01;
  ProgramBinary *binary;
  DescriptorPoolBuilder *this_02;
  DescriptorSetUpdateBuilder *this_03;
  long lVar10;
  NotSupportedError *pNVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  TestStatus *pTVar15;
  uint uVar16;
  uint uVar17;
  uint z;
  int iVar18;
  DeviceDriver *pDVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  UVec3 *pUVar23;
  int iVar24;
  uint uVar25;
  VkExtent3D VVar26;
  VkExtent3D extent_00;
  undefined4 uVar27;
  undefined4 uVar28;
  allocator<char> local_80d;
  deUint32 local_80c;
  DeviceDriver *local_808;
  uint local_800;
  deUint32 local_7fc;
  uint local_7f8;
  uint local_7f4;
  UVec3 *local_7f0;
  ImageSparseResidencyInstance *local_7e8;
  uint local_7dc;
  uint local_7d8;
  uint local_7d4;
  TestStatus *local_7d0;
  TextureFormat *local_7c8;
  ulong local_7c0;
  UVec4 referenceValue;
  VkBufferCreateInfo outputBufferCreateInfo;
  vector<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
  imageResidencyMemoryBinds;
  VkSparseImageMemoryBindInfo imageResidencyBindInfo;
  string local_6e8;
  VkImageAspectFlags local_6c8;
  UVec3 numSparseBinds_1;
  ConstPixelBufferAccess pixelBuffer;
  VkSparseImageOpaqueMemoryBindInfo imageMipTailBindInfo;
  vector<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_> imageMipTailMemoryBinds;
  VkExtent3D local_630;
  UVec3 gridSize;
  RefBase<vk::Handle<(vk::HandleType)9>_> local_618;
  VkDeviceSize local_5f8;
  VkDeviceSize local_5f0;
  UVec4 outputValue;
  UVec3 numSparseBinds;
  VkOffset3D offset;
  undefined4 uStack_5ac;
  vector<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
  sparseMemoryRequirements;
  UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> outputBufferAlloc;
  undefined1 local_560 [28];
  VkExtent3D local_544;
  uint local_538;
  deUint32 local_534;
  undefined8 local_530;
  undefined8 uStack_528;
  deUint32 local_520;
  deUint32 *local_518;
  VkImageLayout local_510;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
  deviceMemUniquePtrVec;
  VkExtent3D extent;
  undefined4 uStack_4dc;
  RefBase<vk::Handle<(vk::HandleType)18>_> local_4c8;
  VkDeviceSize local_4a8;
  VkPipelineStageFlags stageBits [1];
  RefBase<vk::Handle<(vk::HandleType)8>_> local_498;
  RefBase<vk::Handle<(vk::HandleType)7>_> local_478;
  RefBase<vk::Handle<(vk::HandleType)7>_> local_458;
  undefined8 local_438;
  undefined8 uStack_430;
  deUint32 local_428;
  undefined8 local_418;
  undefined8 uStack_410;
  deUint32 local_408;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  deUint32 local_3e8;
  RefBase<vk::Handle<(vk::HandleType)4>_> local_3d8;
  VkExtent3D local_3b0;
  VkDescriptorImageInfo sparseImageInfo;
  RefBase<vk::Handle<(vk::HandleType)7>_> local_388;
  VkPhysicalDeviceProperties physicalDeviceProperties;
  
  local_7d0 = __return_storage_ptr__;
  vk = Context::getInstanceInterface
                 ((this->super_SparseResourcesBaseInstance).super_TestInstance.m_context);
  physicalDevice =
       Context::getPhysicalDevice
                 ((this->super_SparseResourcesBaseInstance).super_TestInstance.m_context);
  ::vk::getPhysicalDeviceProperties(&physicalDeviceProperties,vk,physicalDevice);
  deviceMemUniquePtrVec.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  deviceMemUniquePtrVec.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  deviceMemUniquePtrVec.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pUVar23 = &this->m_imageSize;
  bVar3 = isImageSizeSupported(vk,physicalDevice,this->m_imageType,pUVar23);
  if (bVar3) {
    bVar3 = checkSparseSupportForImageType(vk,physicalDevice,this->m_imageType);
    if (bVar3) {
      local_560._0_4_ = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
      local_560._8_8_ = (void *)0x0;
      local_560._16_4_ = 3;
      local_560._20_4_ = mapImageType(this->m_imageType);
      local_7c8 = &this->m_format;
      local_560._24_4_ = ::vk::mapTextureFormat(local_7c8);
      getLayerSize(this->m_imageType,pUVar23);
      local_544.width = outputBufferCreateInfo.sType;
      local_544.height = outputBufferCreateInfo._4_4_;
      local_544.depth = (uint)outputBufferCreateInfo.pNext;
      local_538 = 1;
      local_534 = getNumLayers(this->m_imageType,pUVar23);
      local_510 = VK_IMAGE_LAYOUT_UNDEFINED;
      local_530._0_4_ = VK_SAMPLE_COUNT_1_BIT;
      local_530._4_4_ = VK_IMAGE_TILING_OPTIMAL;
      uStack_528._0_4_ = 9;
      uStack_528._4_4_ = VK_SHARING_MODE_EXCLUSIVE;
      local_520 = 0;
      local_518 = (deUint32 *)0x0;
      if (this->m_imageType - IMAGE_TYPE_CUBE < 2) {
        local_560._16_4_ = local_560._16_4_ | 0x10;
      }
      bVar3 = checkSparseSupportForImageFormat(vk,physicalDevice,(VkImageCreateInfo *)local_560);
      if (bVar3) {
        outputBufferCreateInfo.flags = 0;
        outputBufferCreateInfo._20_4_ = 0;
        outputBufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
        outputBufferCreateInfo._4_4_ = 0;
        outputBufferCreateInfo.pNext = (void *)0x0;
        pixelBuffer.m_format.order = RGBA;
        pixelBuffer.m_format.type = SNORM_INT16;
        std::vector<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
        ::emplace_back<vkt::sparse::QueueRequirements>
                  ((vector<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
                    *)&outputBufferCreateInfo,(QueueRequirements *)&pixelBuffer);
        pixelBuffer.m_format.order = I;
        pixelBuffer.m_format.type = SNORM_INT16;
        std::vector<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
        ::emplace_back<vkt::sparse::QueueRequirements>
                  ((vector<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
                    *)&outputBufferCreateInfo,(QueueRequirements *)&pixelBuffer);
        SparseResourcesBaseInstance::createDeviceSupportingQueues
                  (&this->super_SparseResourcesBaseInstance,
                   (QueueRequirementsVec *)&outputBufferCreateInfo);
        std::
        _Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
        ::~_Vector_base((_Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
                         *)&outputBufferCreateInfo);
        pDVar19 = (this->super_SparseResourcesBaseInstance).m_deviceDriver.
                  super_UniqueBase<vk::DeviceDriver,_de::DefaultDeleter<vk::DeviceDriver>_>.m_data.
                  ptr;
        pQVar8 = SparseResourcesBaseInstance::getQueue(&this->super_SparseResourcesBaseInstance,8,0)
        ;
        pQVar9 = SparseResourcesBaseInstance::getQueue(&this->super_SparseResourcesBaseInstance,2,0)
        ;
        ::vk::createImage((Move<vk::Handle<(vk::HandleType)9>_> *)&outputBufferCreateInfo,
                          &pDVar19->super_DeviceInterface,
                          (this->super_SparseResourcesBaseInstance).m_logicalDevice.
                          super_RefBase<vk::VkDevice_s_*>.m_data.object,
                          (VkImageCreateInfo *)local_560,(VkAllocationCallbacks *)0x0);
        local_618.m_data.deleter.m_device = (VkDevice)outputBufferCreateInfo._16_8_;
        local_618.m_data.deleter.m_allocator = (VkAllocationCallbacks *)outputBufferCreateInfo.size;
        local_618.m_data.object.m_internal = outputBufferCreateInfo._0_8_;
        local_618.m_data.deleter.m_deviceIface = (DeviceInterface *)outputBufferCreateInfo.pNext;
        outputBufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
        outputBufferCreateInfo._4_4_ = 0;
        outputBufferCreateInfo.pNext = (void *)0x0;
        outputBufferCreateInfo.flags = 0;
        outputBufferCreateInfo._20_4_ = 0;
        outputBufferCreateInfo.size = 0;
        local_7f0 = pUVar23;
        ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::~RefBase
                  ((RefBase<vk::Handle<(vk::HandleType)9>_> *)&outputBufferCreateInfo);
        ::vk::createSemaphore
                  ((Move<vk::Handle<(vk::HandleType)4>_> *)&outputBufferCreateInfo,
                   &pDVar19->super_DeviceInterface,
                   (this->super_SparseResourcesBaseInstance).m_logicalDevice.
                   super_RefBase<vk::VkDevice_s_*>.m_data.object,0,(VkAllocationCallbacks *)0x0);
        local_3d8.m_data.deleter.m_device = (VkDevice)outputBufferCreateInfo._16_8_;
        local_3d8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)outputBufferCreateInfo.size;
        local_3d8.m_data.object.m_internal = outputBufferCreateInfo._0_8_;
        local_3d8.m_data.deleter.m_deviceIface = (DeviceInterface *)outputBufferCreateInfo.pNext;
        outputBufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
        outputBufferCreateInfo._4_4_ = 0;
        outputBufferCreateInfo.pNext = (void *)0x0;
        outputBufferCreateInfo.flags = 0;
        outputBufferCreateInfo._20_4_ = 0;
        outputBufferCreateInfo.size = 0;
        ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)4>_>::~RefBase
                  ((RefBase<vk::Handle<(vk::HandleType)4>_> *)&outputBufferCreateInfo);
        ::vk::getImageMemoryRequirements
                  ((VkMemoryRequirements *)&pixelBuffer,&pDVar19->super_DeviceInterface,
                   (this->super_SparseResourcesBaseInstance).m_logicalDevice.
                   super_RefBase<vk::VkDevice_s_*>.m_data.object,
                   (VkImage)local_618.m_data.object.m_internal);
        if (physicalDeviceProperties.limits.sparseAddressSpaceSize < (ulong)pixelBuffer.m_format) {
          pNVar11 = (NotSupportedError *)__cxa_allocate_exception(0x38);
          tcu::NotSupportedError::NotSupportedError
                    (pNVar11,"Required memory size for sparse resource exceeds device limits",
                     (char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/sparse_resources/vktSparseResourcesImageSparseResidency.cpp"
                     ,0x108);
          __cxa_throw(pNVar11,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
        }
        ::vk::getImageSparseMemoryRequirements
                  (&sparseMemoryRequirements,&pDVar19->super_DeviceInterface,
                   (this->super_SparseResourcesBaseInstance).m_logicalDevice.
                   super_RefBase<vk::VkDevice_s_*>.m_data.object,
                   (VkImage)local_618.m_data.object.m_internal);
        dVar4 = getSparseAspectRequirementsIndex(&sparseMemoryRequirements,1);
        if (dVar4 == 0xffffffff) {
          pNVar11 = (NotSupportedError *)__cxa_allocate_exception(0x38);
          tcu::NotSupportedError::NotSupportedError
                    (pNVar11,
                     "Not supported image aspect - the test supports currently only VK_IMAGE_ASPECT_COLOR_BIT"
                     ,(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/sparse_resources/vktSparseResourcesImageSparseResidency.cpp"
                     ,0x114);
          __cxa_throw(pNVar11,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
        }
        local_6c8 = sparseMemoryRequirements.
                    super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
                    ._M_impl.super__Vector_impl_data._M_start[dVar4].formatProperties.aspectMask;
        local_630.width =
             sparseMemoryRequirements.
             super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
             ._M_impl.super__Vector_impl_data._M_start[dVar4].formatProperties.imageGranularity.
             width;
        local_630.height =
             sparseMemoryRequirements.
             super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
             ._M_impl.super__Vector_impl_data._M_start[dVar4].formatProperties.imageGranularity.
             height;
        local_630.depth =
             sparseMemoryRequirements.
             super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
             ._M_impl.super__Vector_impl_data._M_start[dVar4].formatProperties.imageGranularity.
             depth;
        uVar7 = sparseMemoryRequirements.
                super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
                ._M_impl.super__Vector_impl_data._M_start[dVar4].formatProperties.flags;
        uVar17 = sparseMemoryRequirements.
                 super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
                 ._M_impl.super__Vector_impl_data._M_start[dVar4].imageMipTailFirstLod;
        local_5f8 = sparseMemoryRequirements.
                    super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
                    ._M_impl.super__Vector_impl_data._M_start[dVar4].imageMipTailSize;
        local_5f0 = sparseMemoryRequirements.
                    super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
                    ._M_impl.super__Vector_impl_data._M_start[dVar4].imageMipTailOffset;
        local_4a8 = sparseMemoryRequirements.
                    super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
                    ._M_impl.super__Vector_impl_data._M_start[dVar4].imageMipTailStride;
        imageResidencyMemoryBinds.
        super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        imageResidencyMemoryBinds.
        super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        imageResidencyMemoryBinds.
        super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        imageMipTailMemoryBinds.
        super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        imageMipTailMemoryBinds.
        super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        imageMipTailMemoryBinds.
        super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        dVar4 = findMatchingMemoryType
                          (vk,physicalDevice,(VkMemoryRequirements *)&pixelBuffer,
                           (MemoryRequirement *)&::vk::MemoryRequirement::Any);
        uVar2 = local_630._0_8_;
        pUVar23 = local_7f0;
        VVar26.depth = (deUint32)local_4c8.m_data.deleter.m_deviceIface;
        VVar26.width = (deUint32)local_4c8.m_data.object.m_internal;
        VVar26.height = local_4c8.m_data.object.m_internal._4_4_;
        local_808 = pDVar19;
        if (dVar4 == 0xffffffff) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&outputBufferCreateInfo,"No matching memory type found",
                     (allocator<char> *)&imageResidencyBindInfo);
          pTVar15 = local_7d0;
          tcu::TestStatus::fail(local_7d0,(string *)&outputBufferCreateInfo);
          std::__cxx11::string::~string((string *)&outputBufferCreateInfo);
        }
        else {
          dVar6 = local_630.width;
          dVar5 = local_630.height;
          local_800 = local_630.depth;
          uVar14 = 0;
          local_80c = dVar4;
          local_7e8 = this;
          local_4c8.m_data._0_12_ = VVar26;
          while (pTVar15 = local_7d0, dVar4 = local_80c, uVar14 < local_534) {
            dVar4 = 0;
            local_7c0 = uVar14;
            while (this = local_7e8, pDVar19 = local_808, dVar4 != uVar17) {
              imageMipTailBindInfo.image.m_internal._4_4_ = dVar4;
              imageMipTailBindInfo.image.m_internal._0_4_ = local_6c8;
              imageMipTailBindInfo.bindCount = (deUint32)uVar14;
              local_7fc = dVar4;
              VVar26 = mipLevelExtents(&local_544,dVar4);
              local_4c8.m_data._0_12_ = VVar26;
              alignedDivide((anon_unknown_4 *)&numSparseBinds,(VkExtent3D *)&local_4c8,&local_630);
              uVar21 = 0;
              local_7d8 = (uint)((VVar26._0_8_ & 0xffffffff) % (uVar2 & 0xffffffff));
              if (local_7d8 == 0) {
                local_7d8 = dVar6;
              }
              local_7dc = (uint)((VVar26._0_8_ >> 0x20) % (ulong)dVar5);
              if (local_7dc == 0) {
                local_7dc = dVar5;
              }
              local_7f8 = VVar26.depth % local_800;
              if (local_7f8 == 0) {
                local_7f8 = local_800;
              }
              for (; uVar21 < numSparseBinds.m_data[2]; uVar21 = uVar21 + 1) {
                local_7f4 = uVar21 * local_800;
                for (uVar20 = 0; uVar20 < numSparseBinds.m_data[1]; uVar20 = uVar20 + 1) {
                  local_7d4 = uVar20 * dVar5;
                  iVar24 = 0;
                  for (uVar16 = 0; uVar16 < numSparseBinds.m_data[0]; uVar16 = uVar16 + 1) {
                    if (((((int)uVar14 * numSparseBinds.m_data[2] + uVar21) *
                          numSparseBinds.m_data[1] + uVar20) * numSparseBinds.m_data[0] + uVar16 & 1
                        ) == 0) {
                      extent.width = dVar6;
                      if (uVar16 == numSparseBinds.m_data[0] - 1) {
                        extent.width = local_7d8;
                      }
                      offset.y = local_7d4;
                      offset.x = iVar24;
                      stack0xfffffffffffffa50 = (void *)CONCAT44(uStack_5ac,local_7f4);
                      extent.height = dVar5;
                      if (uVar20 == numSparseBinds.m_data[1] - 1) {
                        extent.height = local_7dc;
                      }
                      uVar25 = local_800;
                      if (uVar21 == numSparseBinds.m_data[2] - 1) {
                        uVar25 = local_7f8;
                      }
                      stack0xfffffffffffffb20 = (void *)CONCAT44(uStack_4dc,uVar25);
                      makeSparseImageMemoryBind
                                ((VkSparseImageMemoryBind *)&outputBufferCreateInfo,
                                 &local_808->super_DeviceInterface,
                                 (local_7e8->super_SparseResourcesBaseInstance).m_logicalDevice.
                                 super_RefBase<vk::VkDevice_s_*>.m_data.object,
                                 pixelBuffer.m_size.m_data._0_8_,local_80c,
                                 (VkImageSubresource *)&imageMipTailBindInfo,&offset,&extent);
                      local_458.m_data.object.m_internal =
                           (deUint64)
                           ::vk::refdetails::check<vk::Handle<(vk::HandleType)7>>
                                     ((Handle<(vk::HandleType)7>)outputBufferCreateInfo._40_8_);
                      local_458.m_data.deleter.m_device =
                           (local_7e8->super_SparseResourcesBaseInstance).m_logicalDevice.
                           super_RefBase<vk::VkDevice_s_*>.m_data.object;
                      local_458.m_data.deleter.m_deviceIface = &local_808->super_DeviceInterface;
                      local_458.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
                      makeVkSharedPtr<vk::Handle<(vk::HandleType)7>>
                                ((sparse *)&imageResidencyBindInfo,
                                 (Move<vk::Handle<(vk::HandleType)7>_> *)&local_458);
                      std::
                      vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>>>>>
                      ::
                      emplace_back<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>>>>
                                ((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>>>>>
                                  *)&deviceMemUniquePtrVec,
                                 (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>
                                  *)&imageResidencyBindInfo);
                      de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>::
                      ~SharedPtr((SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>
                                  *)&imageResidencyBindInfo);
                      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)7>_>::~RefBase
                                (&local_458);
                      std::
                      vector<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                      ::push_back(&imageResidencyMemoryBinds,(value_type *)&outputBufferCreateInfo);
                      uVar14 = local_7c0;
                    }
                    iVar24 = iVar24 + dVar6;
                  }
                }
              }
              pUVar23 = local_7f0;
              dVar4 = local_7fc + 1;
            }
            if (((uVar7 & 1) == 0) && (uVar17 < local_538)) {
              makeSparseMemoryBind
                        ((VkSparseMemoryBind *)&outputBufferCreateInfo,
                         &local_808->super_DeviceInterface,
                         (local_7e8->super_SparseResourcesBaseInstance).m_logicalDevice.
                         super_RefBase<vk::VkDevice_s_*>.m_data.object,local_5f8,local_80c,
                         local_4a8 * local_7c0 + local_5f0);
              local_478.m_data.object.m_internal =
                   (deUint64)
                   ::vk::refdetails::check<vk::Handle<(vk::HandleType)7>>
                             ((Handle<(vk::HandleType)7>)outputBufferCreateInfo._16_8_);
              local_478.m_data.deleter.m_device =
                   (this->super_SparseResourcesBaseInstance).m_logicalDevice.
                   super_RefBase<vk::VkDevice_s_*>.m_data.object;
              local_478.m_data.deleter.m_deviceIface = &pDVar19->super_DeviceInterface;
              local_478.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
              makeVkSharedPtr<vk::Handle<(vk::HandleType)7>>
                        ((sparse *)&imageResidencyBindInfo,
                         (Move<vk::Handle<(vk::HandleType)7>_> *)&local_478);
              std::
              vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>>>>>
              ::emplace_back<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>>>>
                        ((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>>>>>
                          *)&deviceMemUniquePtrVec,
                         (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_> *)
                         &imageResidencyBindInfo);
              de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>::~SharedPtr
                        ((SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_> *)
                         &imageResidencyBindInfo);
              ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)7>_>::~RefBase(&local_478);
              std::vector<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>::
              push_back(&imageMipTailMemoryBinds,(value_type *)&outputBufferCreateInfo);
            }
            uVar14 = local_7c0 + 1;
          }
          if (((uVar7 & 1) != 0) && (uVar17 < local_538)) {
            makeSparseMemoryBind
                      ((VkSparseMemoryBind *)&outputBufferCreateInfo,&pDVar19->super_DeviceInterface
                       ,(this->super_SparseResourcesBaseInstance).m_logicalDevice.
                        super_RefBase<vk::VkDevice_s_*>.m_data.object,local_5f8,local_80c,local_5f0)
            ;
            local_388.m_data.object.m_internal =
                 (deUint64)
                 ::vk::refdetails::check<vk::Handle<(vk::HandleType)7>>
                           ((Handle<(vk::HandleType)7>)outputBufferCreateInfo._16_8_);
            local_388.m_data.deleter.m_device =
                 (this->super_SparseResourcesBaseInstance).m_logicalDevice.
                 super_RefBase<vk::VkDevice_s_*>.m_data.object;
            local_388.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
            local_388.m_data.deleter.m_deviceIface = &pDVar19->super_DeviceInterface;
            makeVkSharedPtr<vk::Handle<(vk::HandleType)7>>
                      ((sparse *)&imageResidencyBindInfo,
                       (Move<vk::Handle<(vk::HandleType)7>_> *)&local_388);
            std::
            vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>>>>>
            ::emplace_back<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>>>>
                      ((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>>>>>
                        *)&deviceMemUniquePtrVec,
                       (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_> *)
                       &imageResidencyBindInfo);
            de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>::~SharedPtr
                      ((SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_> *)
                       &imageResidencyBindInfo);
            ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)7>_>::~RefBase(&local_388);
            std::vector<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>::push_back
                      (&imageMipTailMemoryBinds,(value_type *)&outputBufferCreateInfo);
          }
          outputBufferCreateInfo.pNext = (void *)0x0;
          outputBufferCreateInfo.usage = 0;
          outputBufferCreateInfo.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
          outputBufferCreateInfo.queueFamilyIndexCount = 0;
          outputBufferCreateInfo._44_4_ = 0;
          outputBufferCreateInfo.flags = 0;
          outputBufferCreateInfo._20_4_ = 0;
          outputBufferCreateInfo.size = 0;
          outputBufferCreateInfo.sType = VK_STRUCTURE_TYPE_BIND_SPARSE_INFO;
          outputBufferCreateInfo._4_4_ = 0;
          if ((long)imageResidencyMemoryBinds.
                    super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)imageResidencyMemoryBinds.
                    super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                    ._M_impl.super__Vector_impl_data._M_start != 0) {
            imageResidencyBindInfo.image.m_internal = local_618.m_data.object.m_internal;
            imageResidencyBindInfo.bindCount =
                 (deUint32)
                 ((ulong)((long)imageResidencyMemoryBinds.
                                super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)imageResidencyMemoryBinds.
                               super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 6);
            imageResidencyBindInfo.pBinds =
                 imageResidencyMemoryBinds.
                 super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                 ._M_impl.super__Vector_impl_data._M_start;
          }
          lVar10 = (long)imageMipTailMemoryBinds.
                         super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)imageMipTailMemoryBinds.
                         super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>
                         ._M_impl.super__Vector_impl_data._M_start;
          if (lVar10 != 0) {
            imageMipTailBindInfo.image.m_internal = local_618.m_data.object.m_internal;
            imageMipTailBindInfo.bindCount = (deUint32)(lVar10 / 0x28);
            imageMipTailBindInfo.pBinds =
                 imageMipTailMemoryBinds.
                 super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>
                 ._M_impl.super__Vector_impl_data._M_start;
          }
          outputBufferCreateInfo.pQueueFamilyIndices = (deUint32 *)(ulong)(lVar10 != 0);
          result = (*(pDVar19->super_DeviceInterface)._vptr_DeviceInterface[0x11])
                             (pDVar19,pQVar8->queueHandle,1,&outputBufferCreateInfo);
          ::vk::checkResult(result,
                            "deviceInterface.queueBindSparse(sparseQueue.queueHandle, 1u, &bindSparseInfo, DE_NULL)"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/sparse_resources/vktSparseResourcesImageSparseResidency.cpp"
                            ,0x18b);
        }
        std::_Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>::
        ~_Vector_base(&imageMipTailMemoryBinds.
                       super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>
                     );
        std::_Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
        ::~_Vector_base(&imageResidencyMemoryBinds.
                         super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                       );
        std::
        _Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
        ::~_Vector_base(&sparseMemoryRequirements.
                         super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
                       );
        if (dVar4 != 0xffffffff) {
          makeCommandPool((Move<vk::Handle<(vk::HandleType)24>_> *)&outputBufferCreateInfo,
                          &pDVar19->super_DeviceInterface,
                          (this->super_SparseResourcesBaseInstance).m_logicalDevice.
                          super_RefBase<vk::VkDevice_s_*>.m_data.object,pQVar9->queueFamilyIndex);
          sparseMemoryRequirements.
          super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)outputBufferCreateInfo._16_8_;
          sparseMemoryRequirements.
          super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)outputBufferCreateInfo._0_8_;
          sparseMemoryRequirements.
          super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)outputBufferCreateInfo.pNext;
          outputBufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
          outputBufferCreateInfo._4_4_ = 0;
          outputBufferCreateInfo.pNext = (void *)0x0;
          outputBufferCreateInfo.flags = 0;
          outputBufferCreateInfo._20_4_ = 0;
          outputBufferCreateInfo.size = 0;
          ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase
                    ((RefBase<vk::Handle<(vk::HandleType)24>_> *)&outputBufferCreateInfo);
          ::vk::allocateCommandBuffer
                    ((Move<vk::VkCommandBuffer_s_*> *)&outputBufferCreateInfo,
                     &pDVar19->super_DeviceInterface,
                     (this->super_SparseResourcesBaseInstance).m_logicalDevice.
                     super_RefBase<vk::VkDevice_s_*>.m_data.object,
                     (VkCommandPool)
                     sparseMemoryRequirements.
                     super__Vector_base<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
                     ._M_impl.super__Vector_impl_data._M_start,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
          imageResidencyMemoryBinds.
          super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)outputBufferCreateInfo._16_8_;
          imageResidencyMemoryBinds.
          super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)outputBufferCreateInfo._0_8_;
          imageResidencyMemoryBinds.
          super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)outputBufferCreateInfo.pNext;
          outputBufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
          outputBufferCreateInfo._4_4_ = 0;
          outputBufferCreateInfo.pNext = (void *)0x0;
          outputBufferCreateInfo.flags = 0;
          outputBufferCreateInfo._20_4_ = 0;
          outputBufferCreateInfo.size = 0;
          ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
                    ((RefBase<vk::VkCommandBuffer_s_*> *)&outputBufferCreateInfo);
          beginCommandBuffer(&pDVar19->super_DeviceInterface,
                             (VkCommandBuffer)
                             imageResidencyMemoryBinds.
                             super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                             ._M_impl.super__Vector_impl_data._M_start);
          ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder
                    ((DescriptorSetLayoutBuilder *)&outputBufferCreateInfo);
          this_01 = ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                              ((DescriptorSetLayoutBuilder *)&outputBufferCreateInfo,
                               VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,0x20);
          ::vk::DescriptorSetLayoutBuilder::build
                    ((Move<vk::Handle<(vk::HandleType)19>_> *)&pixelBuffer,this_01,
                     &pDVar19->super_DeviceInterface,
                     (this->super_SparseResourcesBaseInstance).m_logicalDevice.
                     super_RefBase<vk::VkDevice_s_*>.m_data.object,0);
          imageMipTailMemoryBinds.
          super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pixelBuffer._16_8_;
          imageMipTailMemoryBinds.
          super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)pixelBuffer.m_format;
          imageMipTailMemoryBinds.
          super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)pixelBuffer.m_size.m_data._0_8_;
          pixelBuffer.m_format.order = R;
          pixelBuffer.m_format.type = SNORM_INT8;
          pixelBuffer.m_size.m_data[0] = 0;
          pixelBuffer.m_size.m_data[1] = 0;
          pixelBuffer.m_size.m_data[2] = 0;
          pixelBuffer.m_pitch.m_data[0] = 0;
          pixelBuffer.m_pitch.m_data[1] = 0;
          pixelBuffer.m_pitch.m_data[2] = 0;
          ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::~RefBase
                    ((RefBase<vk::Handle<(vk::HandleType)19>_> *)&pixelBuffer);
          ::vk::DescriptorSetLayoutBuilder::~DescriptorSetLayoutBuilder
                    ((DescriptorSetLayoutBuilder *)&outputBufferCreateInfo);
          pVVar1 = (this->super_SparseResourcesBaseInstance).m_logicalDevice.
                   super_RefBase<vk::VkDevice_s_*>.m_data.object;
          this_00 = ((this->super_SparseResourcesBaseInstance).super_TestInstance.m_context)->
                    m_progCollection;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&pixelBuffer,"comp",(allocator<char> *)&imageMipTailBindInfo);
          binary = ::vk::ProgramCollection<vk::ProgramBinary>::get(this_00,(string *)&pixelBuffer);
          ::vk::createShaderModule
                    ((Move<vk::Handle<(vk::HandleType)14>_> *)&outputBufferCreateInfo,
                     &pDVar19->super_DeviceInterface,pVVar1,binary,0);
          imageResidencyBindInfo.pBinds = (VkSparseImageMemoryBind *)outputBufferCreateInfo._16_8_;
          imageResidencyBindInfo.image.m_internal = outputBufferCreateInfo._0_8_;
          imageResidencyBindInfo._8_8_ = outputBufferCreateInfo.pNext;
          outputBufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
          outputBufferCreateInfo._4_4_ = 0;
          outputBufferCreateInfo.pNext = (void *)0x0;
          outputBufferCreateInfo.flags = 0;
          outputBufferCreateInfo._20_4_ = 0;
          outputBufferCreateInfo.size = 0;
          ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase
                    ((RefBase<vk::Handle<(vk::HandleType)14>_> *)&outputBufferCreateInfo);
          std::__cxx11::string::~string((string *)&pixelBuffer);
          makePipelineLayout((Move<vk::Handle<(vk::HandleType)16>_> *)&outputBufferCreateInfo,
                             &pDVar19->super_DeviceInterface,
                             (this->super_SparseResourcesBaseInstance).m_logicalDevice.
                             super_RefBase<vk::VkDevice_s_*>.m_data.object,
                             (VkDescriptorSetLayout)
                             imageMipTailMemoryBinds.
                             super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>
                             ._M_impl.super__Vector_impl_data._M_start);
          imageMipTailBindInfo.pBinds = (VkSparseMemoryBind *)outputBufferCreateInfo._16_8_;
          imageMipTailBindInfo.image.m_internal = outputBufferCreateInfo._0_8_;
          imageMipTailBindInfo._8_8_ = outputBufferCreateInfo.pNext;
          outputBufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
          outputBufferCreateInfo._4_4_ = 0;
          outputBufferCreateInfo.pNext = (void *)0x0;
          outputBufferCreateInfo.flags = 0;
          outputBufferCreateInfo._20_4_ = 0;
          outputBufferCreateInfo.size = 0;
          ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase
                    ((RefBase<vk::Handle<(vk::HandleType)16>_> *)&outputBufferCreateInfo);
          makeComputePipeline((Move<vk::Handle<(vk::HandleType)18>_> *)&outputBufferCreateInfo,
                              &pDVar19->super_DeviceInterface,
                              (this->super_SparseResourcesBaseInstance).m_logicalDevice.
                              super_RefBase<vk::VkDevice_s_*>.m_data.object,
                              (VkPipelineLayout)imageMipTailBindInfo.image.m_internal,
                              (VkShaderModule)imageResidencyBindInfo.image.m_internal,
                              (VkSpecializationInfo *)0x0);
          local_4c8.m_data.deleter.m_device = (VkDevice)outputBufferCreateInfo._16_8_;
          local_4c8.m_data.deleter.m_allocator =
               (VkAllocationCallbacks *)outputBufferCreateInfo.size;
          local_4c8.m_data.object.m_internal = outputBufferCreateInfo._0_8_;
          local_4c8.m_data.deleter.m_deviceIface._0_4_ = (deUint32)outputBufferCreateInfo.pNext;
          local_4c8.m_data.deleter.m_deviceIface._4_4_ =
               (undefined4)((ulong)outputBufferCreateInfo.pNext >> 0x20);
          outputBufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
          outputBufferCreateInfo._4_4_ = 0;
          outputBufferCreateInfo.pNext = (void *)0x0;
          outputBufferCreateInfo.flags = 0;
          outputBufferCreateInfo._20_4_ = 0;
          outputBufferCreateInfo.size = 0;
          ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase
                    ((RefBase<vk::Handle<(vk::HandleType)18>_> *)&outputBufferCreateInfo);
          (*(pDVar19->super_DeviceInterface)._vptr_DeviceInterface[0x4c])
                    (pDVar19,imageResidencyMemoryBinds.
                             super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                             ._M_impl.super__Vector_impl_data._M_start,1,
                     local_4c8.m_data.object.m_internal);
          ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder((DescriptorPoolBuilder *)&pixelBuffer);
          this_02 = ::vk::DescriptorPoolBuilder::addType
                              ((DescriptorPoolBuilder *)&pixelBuffer,
                               VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,1);
          ::vk::DescriptorPoolBuilder::build
                    ((Move<vk::Handle<(vk::HandleType)21>_> *)&outputBufferCreateInfo,this_02,
                     &pDVar19->super_DeviceInterface,
                     (this->super_SparseResourcesBaseInstance).m_logicalDevice.
                     super_RefBase<vk::VkDevice_s_*>.m_data.object,1,1);
          numSparseBinds.m_data[0] = outputBufferCreateInfo.sType;
          numSparseBinds.m_data[1] = outputBufferCreateInfo._4_4_;
          stack0xfffffffffffffa30 = (DeviceInterface *)outputBufferCreateInfo.pNext;
          outputBufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
          outputBufferCreateInfo._4_4_ = 0;
          outputBufferCreateInfo.pNext = (void *)0x0;
          outputBufferCreateInfo.flags = 0;
          outputBufferCreateInfo._20_4_ = 0;
          outputBufferCreateInfo.size = 0;
          ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::~RefBase
                    ((RefBase<vk::Handle<(vk::HandleType)21>_> *)&outputBufferCreateInfo);
          std::_Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>::
          ~_Vector_base((_Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>
                         *)&pixelBuffer);
          makeDescriptorSet((Move<vk::Handle<(vk::HandleType)22>_> *)&outputBufferCreateInfo,
                            &pDVar19->super_DeviceInterface,
                            (this->super_SparseResourcesBaseInstance).m_logicalDevice.
                            super_RefBase<vk::VkDevice_s_*>.m_data.object,
                            (VkDescriptorPool)numSparseBinds.m_data._0_8_,
                            (VkDescriptorSetLayout)
                            imageMipTailMemoryBinds.
                            super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>
                            ._M_impl.super__Vector_impl_data._M_start);
          offset.x = outputBufferCreateInfo.sType;
          offset.y = outputBufferCreateInfo._4_4_;
          stack0xfffffffffffffa50 = outputBufferCreateInfo.pNext;
          outputBufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
          outputBufferCreateInfo._4_4_ = 0;
          outputBufferCreateInfo.pNext = (void *)0x0;
          outputBufferCreateInfo.flags = 0;
          outputBufferCreateInfo._20_4_ = 0;
          outputBufferCreateInfo.size = 0;
          ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::~RefBase
                    ((RefBase<vk::Handle<(vk::HandleType)22>_> *)&outputBufferCreateInfo);
          dVar5 = getNumLayers(this->m_imageType,pUVar23);
          image.m_internal = local_618.m_data.object.m_internal;
          pVVar1 = (this->super_SparseResourcesBaseInstance).m_logicalDevice.
                   super_RefBase<vk::VkDevice_s_*>.m_data.object;
          imageViewType = mapImageViewType(this->m_imageType);
          format = ::vk::mapTextureFormat(local_7c8);
          local_3f8 = 1;
          uStack_3f0 = 1;
          subresourceRange.levelCount = 1;
          subresourceRange.aspectMask = 1;
          subresourceRange.baseMipLevel = 0;
          subresourceRange.baseArrayLayer = 0;
          subresourceRange.layerCount = dVar5;
          local_3e8 = dVar5;
          makeImageView((Move<vk::Handle<(vk::HandleType)13>_> *)&outputBufferCreateInfo,
                        &local_808->super_DeviceInterface,pVVar1,(VkImage)image.m_internal,
                        imageViewType,format,subresourceRange);
          extent.width = outputBufferCreateInfo.sType;
          extent.height = outputBufferCreateInfo._4_4_;
          stack0xfffffffffffffb20 = outputBufferCreateInfo.pNext;
          outputBufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
          outputBufferCreateInfo._4_4_ = 0;
          outputBufferCreateInfo.pNext = (void *)0x0;
          outputBufferCreateInfo.flags = 0;
          outputBufferCreateInfo._20_4_ = 0;
          outputBufferCreateInfo.size = 0;
          ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::~RefBase
                    ((RefBase<vk::Handle<(vk::HandleType)13>_> *)&outputBufferCreateInfo);
          sparseImageInfo.sampler.m_internal = 0;
          sparseImageInfo.imageView.m_internal._0_4_ = extent.width;
          sparseImageInfo.imageView.m_internal._4_4_ = extent.height;
          sparseImageInfo.imageLayout = VK_IMAGE_LAYOUT_GENERAL;
          ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder
                    ((DescriptorSetUpdateBuilder *)&outputBufferCreateInfo);
          pixelBuffer.m_format.order = R;
          pixelBuffer.m_format.type = SNORM_INT8;
          this_03 = ::vk::DescriptorSetUpdateBuilder::writeSingle
                              ((DescriptorSetUpdateBuilder *)&outputBufferCreateInfo,
                               (VkDescriptorSet)offset._0_8_,(Location *)&pixelBuffer,
                               VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,&sparseImageInfo);
          pDVar19 = local_808;
          ::vk::DescriptorSetUpdateBuilder::update
                    (this_03,&local_808->super_DeviceInterface,
                     (this->super_SparseResourcesBaseInstance).m_logicalDevice.
                     super_RefBase<vk::VkDevice_s_*>.m_data.object);
          ::vk::DescriptorSetUpdateBuilder::~DescriptorSetUpdateBuilder
                    ((DescriptorSetUpdateBuilder *)&outputBufferCreateInfo);
          (*(pDVar19->super_DeviceInterface)._vptr_DeviceInterface[0x56])
                    (pDVar19,imageResidencyMemoryBinds.
                             super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                             ._M_impl.super__Vector_impl_data._M_start,1,
                     imageMipTailBindInfo.image.m_internal,0,1,(int)&offset,0,0);
          dVar6 = pQVar9->queueFamilyIndex;
          dVar4 = pQVar8->queueFamilyIndex;
          if (pQVar8->queueFamilyIndex == pQVar9->queueFamilyIndex) {
            dVar6 = 0xffffffff;
            dVar4 = 0xffffffff;
          }
          local_418 = 1;
          uStack_410 = 1;
          subresourceRange_01.levelCount = 1;
          subresourceRange_01.aspectMask = 1;
          subresourceRange_01.baseMipLevel = 0;
          subresourceRange_01.baseArrayLayer = 0;
          subresourceRange_01.layerCount = dVar5;
          local_408 = dVar5;
          makeImageMemoryBarrier
                    ((VkImageMemoryBarrier *)&outputBufferCreateInfo,0,0x40,
                     VK_IMAGE_LAYOUT_UNDEFINED,VK_IMAGE_LAYOUT_GENERAL,dVar4,dVar6,
                     (VkImage)local_618.m_data.object.m_internal,subresourceRange_01);
          (*(pDVar19->super_DeviceInterface)._vptr_DeviceInterface[0x6d])
                    (pDVar19,imageResidencyMemoryBinds.
                             super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                             ._M_impl.super__Vector_impl_data._M_start,1,0x800,0,0,0,0,0,1,
                     (int)(VkImageMemoryBarrier *)&outputBufferCreateInfo);
          getShaderGridSize((sparse *)&gridSize,this->m_imageType,local_7f0,0);
          computeWorkGroupSize((anon_unknown_4 *)&outputBufferCreateInfo,&gridSize);
          uVar21 = (gridSize.m_data[0] / outputBufferCreateInfo.sType + 1) -
                   (uint)(gridSize.m_data[0] % outputBufferCreateInfo.sType == 0);
          uVar20 = (gridSize.m_data[1] / (uint)outputBufferCreateInfo._4_4_ + 1) -
                   (uint)(gridSize.m_data[1] % (uint)outputBufferCreateInfo._4_4_ == 0);
          uVar7 = (gridSize.m_data[2] / (uint)outputBufferCreateInfo.pNext + 1) -
                  (uint)((int)((ulong)gridSize.m_data[2] %
                              ((ulong)outputBufferCreateInfo.pNext & 0xffffffff)) == 0);
          if (((0xffff < uVar21) || (0xffff < uVar20)) || (0xffff < uVar7)) {
            pNVar11 = (NotSupportedError *)__cxa_allocate_exception(0x38);
            tcu::NotSupportedError::NotSupportedError
                      (pNVar11,"Image size is not supported",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/sparse_resources/vktSparseResourcesImageSparseResidency.cpp"
                       ,0x1d3);
            __cxa_throw(pNVar11,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
          }
          (*(pDVar19->super_DeviceInterface)._vptr_DeviceInterface[0x5d])
                    (pDVar19,imageResidencyMemoryBinds.
                             super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                             ._M_impl.super__Vector_impl_data._M_start,(ulong)uVar21,(ulong)uVar20,
                     (ulong)uVar7);
          local_438 = 1;
          uStack_430 = 1;
          subresourceRange_00.levelCount = 1;
          subresourceRange_00.aspectMask = 1;
          subresourceRange_00.baseMipLevel = 0;
          subresourceRange_00.baseArrayLayer = 0;
          subresourceRange_00.layerCount = dVar5;
          local_428 = dVar5;
          makeImageMemoryBarrier
                    ((VkImageMemoryBarrier *)&outputBufferCreateInfo,0x40,0x800,
                     VK_IMAGE_LAYOUT_GENERAL,VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
                     (VkImage)local_618.m_data.object.m_internal,subresourceRange_00);
          uVar27 = 0;
          uVar28 = 0;
          (*(pDVar19->super_DeviceInterface)._vptr_DeviceInterface[0x6d])
                    (pDVar19,imageResidencyMemoryBinds.
                             super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                             ._M_impl.super__Vector_impl_data._M_start,0x800,0x1000,0,0,0,0,0,1,
                     (int)(VkImageMemoryBarrier *)&outputBufferCreateInfo);
          dVar4 = getNumPixels(this->m_imageType,local_7f0);
          iVar24 = tcu::getPixelSize(*local_7c8);
          uVar14 = (ulong)(iVar24 * dVar4);
          makeBufferCreateInfo(&outputBufferCreateInfo,uVar14,2);
          pDVar19 = local_808;
          ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&pixelBuffer,
                             &local_808->super_DeviceInterface,
                             (this->super_SparseResourcesBaseInstance).m_logicalDevice.
                             super_RefBase<vk::VkDevice_s_*>.m_data.object,&outputBufferCreateInfo,
                             (VkAllocationCallbacks *)0x0);
          local_498.m_data.deleter.m_device = (VkDevice)pixelBuffer._16_8_;
          local_498.m_data.deleter.m_allocator =
               (VkAllocationCallbacks *)pixelBuffer.m_pitch.m_data._4_8_;
          local_498.m_data.object.m_internal._0_4_ = pixelBuffer.m_format.order;
          local_498.m_data.object.m_internal._4_4_ = pixelBuffer.m_format.type;
          local_498.m_data.deleter.m_deviceIface =
               (DeviceInterface *)pixelBuffer.m_size.m_data._0_8_;
          pixelBuffer.m_format.order = R;
          pixelBuffer.m_format.type = SNORM_INT8;
          pixelBuffer.m_size.m_data[0] = 0;
          pixelBuffer.m_size.m_data[1] = 0;
          pixelBuffer.m_size.m_data[2] = 0;
          pixelBuffer.m_pitch.m_data[0] = 0;
          pixelBuffer.m_pitch.m_data[1] = 0;
          pixelBuffer.m_pitch.m_data[2] = 0;
          ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase
                    ((RefBase<vk::Handle<(vk::HandleType)8>_> *)&pixelBuffer);
          bindBuffer((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&pixelBuffer,
                     &pDVar19->super_DeviceInterface,
                     (this->super_SparseResourcesBaseInstance).m_logicalDevice.
                     super_RefBase<vk::VkDevice_s_*>.m_data.object,
                     (this->super_SparseResourcesBaseInstance).m_allocator.
                     super_UniqueBase<vk::Allocator,_de::DefaultDeleter<vk::Allocator>_>.m_data.ptr,
                     (VkBuffer)local_498.m_data.object.m_internal,(MemoryRequirement)0x1);
          outputBufferAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
          m_data.ptr = (Allocation *)pixelBuffer.m_format;
          pixelBuffer.m_format.order = R;
          pixelBuffer.m_format.type = SNORM_INT8;
          de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
                    ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&pixelBuffer
                    );
          extent_00.height = 0;
          extent_00.width = local_544.depth;
          extent_00.depth = local_534;
          makeBufferImageCopy((VkBufferImageCopy *)&pixelBuffer,(sparse *)local_544._0_8_,extent_00,
                              0,0,CONCAT44(uVar28,uVar27));
          (*(pDVar19->super_DeviceInterface)._vptr_DeviceInterface[99])
                    (pDVar19,imageResidencyMemoryBinds.
                             super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                     local_618.m_data.object.m_internal,6,local_498.m_data.object.m_internal,1,
                     (int)(VkBufferImageCopy *)&pixelBuffer);
          makeBufferMemoryBarrier
                    ((VkBufferMemoryBarrier *)&pixelBuffer,0x1000,0x2000,
                     (VkBuffer)local_498.m_data.object.m_internal,0,uVar14);
          (*(pDVar19->super_DeviceInterface)._vptr_DeviceInterface[0x6d])
                    (pDVar19,imageResidencyMemoryBinds.
                             super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                             ._M_impl.super__Vector_impl_data._M_start,0x1000,0x4000,0,0,0,1,
                     (int)(VkBufferMemoryBarrier *)&pixelBuffer,0,0);
          endCommandBuffer(&pDVar19->super_DeviceInterface,
                           (VkCommandBuffer)
                           imageResidencyMemoryBinds.
                           super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                           ._M_impl.super__Vector_impl_data._M_start);
          stageBits[0] = 0x800;
          submitCommandsAndWait
                    (&pDVar19->super_DeviceInterface,
                     (this->super_SparseResourcesBaseInstance).m_logicalDevice.
                     super_RefBase<vk::VkDevice_s_*>.m_data.object,pQVar9->queueHandle,
                     (VkCommandBuffer)
                     imageResidencyMemoryBinds.
                     super__Vector_base<vk::VkSparseImageMemoryBind,_std::allocator<vk::VkSparseImageMemoryBind>_>
                     ._M_impl.super__Vector_impl_data._M_start,1,(VkSemaphore *)&local_3d8,stageBits
                     ,0,(VkSemaphore *)0x0);
          ::vk::invalidateMappedMemoryRange
                    (&pDVar19->super_DeviceInterface,
                     (this->super_SparseResourcesBaseInstance).m_logicalDevice.
                     super_RefBase<vk::VkDevice_s_*>.m_data.object,
                     (VkDeviceMemory)
                     ((outputBufferAlloc.
                       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
                      ptr)->m_memory).m_internal,
                     (outputBufferAlloc.
                      super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
                     ptr)->m_offset,uVar14);
          tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                    (&pixelBuffer,local_7c8,gridSize.m_data[0],gridSize.m_data[1],gridSize.m_data[2]
                     ,(outputBufferAlloc.
                       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
                      ptr)->m_hostPtr);
          (*(pDVar19->super_DeviceInterface)._vptr_DeviceInterface[3])(pDVar19);
          if (uVar17 == 0) {
            VVar26 = mipLevelExtents(&local_544,0);
            pDVar19 = (DeviceDriver *)(VVar26._0_8_ >> 0x20);
            local_7e8 = (ImageSparseResidencyInstance *)CONCAT44(local_7e8._4_4_,VVar26.depth);
            dVar4 = VVar26.depth;
            local_808 = pDVar19;
            for (uVar7 = 0; uVar7 < local_534 * dVar4; uVar7 = uVar7 + 1) {
              for (uVar17 = 0; uVar17 != (uint)pDVar19; uVar17 = uVar17 + 1) {
                uVar14 = 0;
                while( true ) {
                  dVar4 = (deUint32)uVar14;
                  if (VVar26.width == dVar4) break;
                  referenceValue.m_data[1] = uVar17 % 0x7f;
                  referenceValue.m_data[0] = (int)(uVar14 / 0x7f) * -0x7f + dVar4;
                  referenceValue.m_data[3] = 1;
                  referenceValue.m_data[2] = uVar7 % 0x7f;
                  tcu::ConstPixelBufferAccess::getPixelUint
                            ((ConstPixelBufferAccess *)&outputValue,(int)&pixelBuffer,dVar4,uVar17);
                  iVar24 = tcu::getNumUsedChannels(local_7c8->order);
                  iVar24 = bcmp(&outputValue,&referenceValue,(long)iVar24 << 2);
                  if (iVar24 != 0) {
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_6e8,"Failed",(allocator<char> *)&local_3b0);
                    pTVar15 = local_7d0;
                    tcu::TestStatus::fail(local_7d0,&local_6e8);
                    goto LAB_006fbdd2;
                  }
                  uVar14 = (ulong)(dVar4 + 1);
                }
                pDVar19 = local_808;
              }
              dVar4 = (deUint32)local_7e8;
            }
          }
          else {
            uVar17 = 0;
            local_3b0 = mipLevelExtents(&local_544,0);
            uVar7 = local_3b0.depth;
            uVar14 = local_3b0._0_8_;
            alignedDivide((anon_unknown_4 *)&numSparseBinds_1,&local_3b0,&local_630);
            local_800 = (uint)((uVar14 & 0xffffffff) % (local_630._0_8_ & 0xffffffff));
            local_7d4 = local_630.width;
            if (local_800 == 0) {
              local_800 = local_630.width;
            }
            uVar14 = (uVar14 >> 0x20) % (ulong)local_630.height;
            if ((int)uVar14 == 0) {
              uVar14 = (ulong)local_630.height;
            }
            uVar12 = (ulong)uVar7 % (ulong)local_630.depth;
            if ((int)uVar12 == 0) {
              uVar12 = (ulong)local_630.depth;
            }
            local_7e8 = (ImageSparseResidencyInstance *)CONCAT44(local_7e8._4_4_,local_630.height);
            local_7c0 = CONCAT44(local_7c0._4_4_,(int)uVar14);
            local_80c = local_630.depth;
            local_7fc = (deUint32)uVar12;
            dVar4 = local_630.depth;
            for (; uVar17 < local_534; uVar17 = uVar17 + 1) {
              for (uVar7 = 0; uVar7 < numSparseBinds_1.m_data[2]; uVar7 = uVar7 + 1) {
                local_7f8 = uVar7;
                for (uVar21 = 0; uVar21 < numSparseBinds_1.m_data[1]; uVar21 = uVar21 + 1) {
                  uVar20 = uVar21 * (deUint32)local_7e8;
                  uVar16 = 0;
                  local_7f4 = uVar21;
                  while( true ) {
                    if (numSparseBinds_1.m_data[0] <= uVar16) break;
                    uVar22 = uVar16 * local_7d4;
                    iVar24 = numSparseBinds_1.m_data[2] * uVar17 + uVar7;
                    uVar13 = iVar24 * dVar4;
                    uVar25 = local_7d4;
                    if (uVar16 == numSparseBinds_1.m_data[0] - 1) {
                      uVar25 = local_800;
                    }
                    iVar18 = (deUint32)local_7e8;
                    if (uVar21 == numSparseBinds_1.m_data[1] - 1) {
                      iVar18 = (int)uVar14;
                    }
                    dVar6 = dVar4;
                    if (uVar7 == numSparseBinds_1.m_data[2] - 1) {
                      dVar6 = (deUint32)uVar12;
                    }
                    local_808 = (DeviceDriver *)CONCAT44(local_808._4_4_,uVar22);
                    local_7dc = uVar16;
                    if (((iVar24 * numSparseBinds_1.m_data[1] + uVar21) * numSparseBinds_1.m_data[0]
                         + uVar16 & 1) == 0) {
                      local_7d8 = iVar18 + uVar20;
                      local_7f0 = (UVec3 *)CONCAT44(local_7f0._4_4_,dVar6 + uVar13);
                      uVar16 = dVar6 + uVar13;
                      for (; uVar13 < uVar16; uVar13 = uVar13 + 1) {
                        for (uVar7 = uVar20; uVar7 < local_7d8; uVar7 = uVar7 + 1) {
                          for (uVar21 = (uint)local_808; uVar21 < uVar25 + uVar22;
                              uVar21 = uVar21 + 1) {
                            referenceValue.m_data[1] = uVar7 % 0x7f;
                            referenceValue.m_data[0] = uVar21 % 0x7f;
                            referenceValue.m_data[3] = 1;
                            referenceValue.m_data[2] = uVar13 % 0x7f;
                            tcu::ConstPixelBufferAccess::getPixelUint
                                      ((ConstPixelBufferAccess *)&outputValue,(int)&pixelBuffer,
                                       uVar21,uVar7);
                            iVar24 = tcu::getNumUsedChannels(local_7c8->order);
                            iVar24 = bcmp(&outputValue,&referenceValue,(long)iVar24 << 2);
                            if (iVar24 != 0) {
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((string *)&local_6e8,"Failed",&local_80d);
                              pTVar15 = local_7d0;
                              tcu::TestStatus::fail(local_7d0,&local_6e8);
                              goto LAB_006fbdd2;
                            }
                          }
                          uVar21 = local_7f4;
                        }
                        uVar14 = local_7c0 & 0xffffffff;
                        uVar12 = (ulong)local_7fc;
                        dVar4 = local_80c;
                        uVar16 = (uint)local_7f0;
                        uVar7 = local_7f8;
                      }
                    }
                    else if (physicalDeviceProperties.sparseProperties.residencyNonResidentStrict !=
                             0) {
                      uVar25 = uVar25 + uVar22;
                      local_7f0 = (UVec3 *)CONCAT44(local_7f0._4_4_,dVar6 + uVar13);
                      uVar16 = dVar6 + uVar13;
                      for (; z = uVar20, uVar13 < uVar16; uVar13 = uVar13 + 1) {
                        for (; uVar16 = uVar22, z < iVar18 + uVar20; z = z + 1) {
                          for (; uVar16 < uVar25; uVar16 = uVar16 + 1) {
                            referenceValue.m_data[0] = 0;
                            referenceValue.m_data[1] = 0;
                            referenceValue.m_data[2] = 0;
                            referenceValue.m_data[3] = 0;
                            tcu::ConstPixelBufferAccess::getPixelUint
                                      ((ConstPixelBufferAccess *)&outputValue,(int)&pixelBuffer,
                                       uVar16,z);
                            iVar24 = tcu::getNumUsedChannels(local_7c8->order);
                            iVar24 = bcmp(&outputValue,&referenceValue,(long)iVar24 << 2);
                            if (iVar24 != 0) {
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((string *)&local_6e8,"Failed",&local_80d);
                              pTVar15 = local_7d0;
                              tcu::TestStatus::fail(local_7d0,&local_6e8);
                              goto LAB_006fbdd2;
                            }
                            uVar22 = (uint)local_808;
                          }
                          uVar14 = local_7c0 & 0xffffffff;
                          uVar12 = (ulong)local_7fc;
                          dVar4 = local_80c;
                          uVar7 = local_7f8;
                          uVar21 = local_7f4;
                        }
                        uVar16 = (uint)local_7f0;
                      }
                    }
                    uVar16 = local_7dc + 1;
                  }
                }
              }
            }
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_6e8,"Passed",(allocator<char> *)&referenceValue);
          pTVar15 = local_7d0;
          tcu::TestStatus::pass(local_7d0,&local_6e8);
LAB_006fbdd2:
          std::__cxx11::string::~string((string *)&local_6e8);
          de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
                    (&outputBufferAlloc.
                      super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
          ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase(&local_498);
          ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::~RefBase
                    ((RefBase<vk::Handle<(vk::HandleType)13>_> *)&extent);
          ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::~RefBase
                    ((RefBase<vk::Handle<(vk::HandleType)22>_> *)&offset);
          ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::~RefBase
                    ((RefBase<vk::Handle<(vk::HandleType)21>_> *)&numSparseBinds);
          ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase(&local_4c8);
          ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase
                    ((RefBase<vk::Handle<(vk::HandleType)16>_> *)&imageMipTailBindInfo);
          ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase
                    ((RefBase<vk::Handle<(vk::HandleType)14>_> *)&imageResidencyBindInfo);
          ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::~RefBase
                    ((RefBase<vk::Handle<(vk::HandleType)19>_> *)&imageMipTailMemoryBinds);
          ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
                    ((RefBase<vk::VkCommandBuffer_s_*> *)&imageResidencyMemoryBinds);
          ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase
                    ((RefBase<vk::Handle<(vk::HandleType)24>_> *)&sparseMemoryRequirements);
        }
        ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)4>_>::~RefBase(&local_3d8);
        ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::~RefBase(&local_618);
        std::
        vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
        ::~vector(&deviceMemUniquePtrVec);
        return pTVar15;
      }
      pNVar11 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (pNVar11,"The image format does not support sparse operations",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/sparse_resources/vktSparseResourcesImageSparseResidency.cpp"
                 ,0xee);
    }
    else {
      pNVar11 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (pNVar11,"Sparse residency for image type is not supported",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/sparse_resources/vktSparseResourcesImageSparseResidency.cpp"
                 ,0xd4);
    }
  }
  else {
    pNVar11 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar11,"Image size not supported for device",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/sparse_resources/vktSparseResourcesImageSparseResidency.cpp"
               ,0xd0);
  }
  __cxa_throw(pNVar11,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestStatus ImageSparseResidencyInstance::iterate (void)
{
	const InstanceInterface&			instance = m_context.getInstanceInterface();
	const VkPhysicalDevice				physicalDevice = m_context.getPhysicalDevice();
	const VkPhysicalDeviceProperties	physicalDeviceProperties = getPhysicalDeviceProperties(instance, physicalDevice);
	VkImageCreateInfo					imageCreateInfo;
	VkSparseImageMemoryRequirements		aspectRequirements;
	VkExtent3D							imageGranularity;
	std::vector<DeviceMemorySp>			deviceMemUniquePtrVec;

	// Check if image size does not exceed device limits
	if (!isImageSizeSupported(instance, physicalDevice, m_imageType, m_imageSize))
		TCU_THROW(NotSupportedError, "Image size not supported for device");

	// Check if device supports sparse operations for image type
	if (!checkSparseSupportForImageType(instance, physicalDevice, m_imageType))
		TCU_THROW(NotSupportedError, "Sparse residency for image type is not supported");

	imageCreateInfo.sType					= VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
	imageCreateInfo.pNext					= DE_NULL;
	imageCreateInfo.flags					= VK_IMAGE_CREATE_SPARSE_RESIDENCY_BIT | VK_IMAGE_CREATE_SPARSE_BINDING_BIT;
	imageCreateInfo.imageType				= mapImageType(m_imageType);
	imageCreateInfo.format					= mapTextureFormat(m_format);
	imageCreateInfo.extent					= makeExtent3D(getLayerSize(m_imageType, m_imageSize));
	imageCreateInfo.mipLevels				= 1u;
	imageCreateInfo.arrayLayers				= getNumLayers(m_imageType, m_imageSize);
	imageCreateInfo.samples					= VK_SAMPLE_COUNT_1_BIT;
	imageCreateInfo.tiling					= VK_IMAGE_TILING_OPTIMAL;
	imageCreateInfo.initialLayout			= VK_IMAGE_LAYOUT_UNDEFINED;
	imageCreateInfo.usage					= VK_IMAGE_USAGE_TRANSFER_SRC_BIT |
											  VK_IMAGE_USAGE_STORAGE_BIT;
	imageCreateInfo.sharingMode				= VK_SHARING_MODE_EXCLUSIVE;
	imageCreateInfo.queueFamilyIndexCount	= 0u;
	imageCreateInfo.pQueueFamilyIndices		= DE_NULL;

	if (m_imageType == IMAGE_TYPE_CUBE || m_imageType == IMAGE_TYPE_CUBE_ARRAY)
	{
		imageCreateInfo.flags |= VK_IMAGE_CREATE_CUBE_COMPATIBLE_BIT;
	}

	// Check if device supports sparse operations for image format
	if (!checkSparseSupportForImageFormat(instance, physicalDevice, imageCreateInfo))
		TCU_THROW(NotSupportedError, "The image format does not support sparse operations");

	{
		// Create logical device supporting both sparse and compute queues
		QueueRequirementsVec queueRequirements;
		queueRequirements.push_back(QueueRequirements(VK_QUEUE_SPARSE_BINDING_BIT, 1u));
		queueRequirements.push_back(QueueRequirements(VK_QUEUE_COMPUTE_BIT, 1u));

		createDeviceSupportingQueues(queueRequirements);
	}

	const DeviceInterface&	deviceInterface	= getDeviceInterface();
	const Queue&			sparseQueue		= getQueue(VK_QUEUE_SPARSE_BINDING_BIT, 0);
	const Queue&			computeQueue	= getQueue(VK_QUEUE_COMPUTE_BIT, 0);

	// Create sparse image
	const Unique<VkImage> sparseImage(createImage(deviceInterface, getDevice(), &imageCreateInfo));

	// Create sparse image memory bind semaphore
	const Unique<VkSemaphore> imageMemoryBindSemaphore(createSemaphore(deviceInterface, getDevice()));

	{
		// Get image general memory requirements
		const VkMemoryRequirements imageMemoryRequirements = getImageMemoryRequirements(deviceInterface, getDevice(), *sparseImage);

		if (imageMemoryRequirements.size > physicalDeviceProperties.limits.sparseAddressSpaceSize)
			TCU_THROW(NotSupportedError, "Required memory size for sparse resource exceeds device limits");

		DE_ASSERT((imageMemoryRequirements.size % imageMemoryRequirements.alignment) == 0);

		// Get sparse image sparse memory requirements
		const std::vector<VkSparseImageMemoryRequirements> sparseMemoryRequirements = getImageSparseMemoryRequirements(deviceInterface, getDevice(), *sparseImage);

		DE_ASSERT(sparseMemoryRequirements.size() != 0);

		const deUint32 colorAspectIndex = getSparseAspectRequirementsIndex(sparseMemoryRequirements, VK_IMAGE_ASPECT_COLOR_BIT);

		if (colorAspectIndex == NO_MATCH_FOUND)
			TCU_THROW(NotSupportedError, "Not supported image aspect - the test supports currently only VK_IMAGE_ASPECT_COLOR_BIT");

		aspectRequirements	= sparseMemoryRequirements[colorAspectIndex];
		imageGranularity	= aspectRequirements.formatProperties.imageGranularity;

		const VkImageAspectFlags aspectMask = aspectRequirements.formatProperties.aspectMask;

		DE_ASSERT((aspectRequirements.imageMipTailSize % imageMemoryRequirements.alignment) == 0);

		std::vector<VkSparseImageMemoryBind> imageResidencyMemoryBinds;
		std::vector<VkSparseMemoryBind>		 imageMipTailMemoryBinds;

		const deUint32						 memoryType = findMatchingMemoryType(instance, physicalDevice, imageMemoryRequirements, MemoryRequirement::Any);

		if (memoryType == NO_MATCH_FOUND)
			return tcu::TestStatus::fail("No matching memory type found");

		// Bind device memory for each aspect
		for (deUint32 layerNdx = 0; layerNdx < imageCreateInfo.arrayLayers; ++layerNdx)
		{
			for (deUint32 mipLevelNdx = 0; mipLevelNdx < aspectRequirements.imageMipTailFirstLod; ++mipLevelNdx)
			{
				const VkImageSubresource subresource		= { aspectMask, mipLevelNdx, layerNdx };
				const VkExtent3D		 mipExtent			= mipLevelExtents(imageCreateInfo.extent, mipLevelNdx);
				const tcu::UVec3		 numSparseBinds		= alignedDivide(mipExtent, imageGranularity);
				const tcu::UVec3		 lastBlockExtent	= tcu::UVec3(mipExtent.width  % imageGranularity.width  ? mipExtent.width   % imageGranularity.width  : imageGranularity.width,
																		 mipExtent.height % imageGranularity.height ? mipExtent.height  % imageGranularity.height : imageGranularity.height,
																		 mipExtent.depth  % imageGranularity.depth  ? mipExtent.depth   % imageGranularity.depth  : imageGranularity.depth);
				for (deUint32 z = 0; z < numSparseBinds.z(); ++z)
				for (deUint32 y = 0; y < numSparseBinds.y(); ++y)
				for (deUint32 x = 0; x < numSparseBinds.x(); ++x)
				{
					const deUint32 linearIndex = x + y*numSparseBinds.x() + z*numSparseBinds.x()*numSparseBinds.y() + layerNdx*numSparseBinds.x()*numSparseBinds.y()*numSparseBinds.z();

					if (linearIndex % 2u == 1u)
					{
						continue;
					}

					VkOffset3D offset;
					offset.x = x*imageGranularity.width;
					offset.y = y*imageGranularity.height;
					offset.z = z*imageGranularity.depth;

					VkExtent3D extent;
					extent.width  = (x == numSparseBinds.x() - 1) ? lastBlockExtent.x() : imageGranularity.width;
					extent.height = (y == numSparseBinds.y() - 1) ? lastBlockExtent.y() : imageGranularity.height;
					extent.depth  = (z == numSparseBinds.z() - 1) ? lastBlockExtent.z() : imageGranularity.depth;

					const VkSparseImageMemoryBind imageMemoryBind = makeSparseImageMemoryBind(deviceInterface, getDevice(),
						imageMemoryRequirements.alignment, memoryType, subresource, offset, extent);

					deviceMemUniquePtrVec.push_back(makeVkSharedPtr(Move<VkDeviceMemory>(check<VkDeviceMemory>(imageMemoryBind.memory), Deleter<VkDeviceMemory>(deviceInterface, getDevice(), DE_NULL))));

					imageResidencyMemoryBinds.push_back(imageMemoryBind);
				}
			}

			if (!(aspectRequirements.formatProperties.flags & VK_SPARSE_IMAGE_FORMAT_SINGLE_MIPTAIL_BIT) && aspectRequirements.imageMipTailFirstLod < imageCreateInfo.mipLevels)
			{
				const VkSparseMemoryBind imageMipTailMemoryBind = makeSparseMemoryBind(deviceInterface, getDevice(),
					aspectRequirements.imageMipTailSize, memoryType, aspectRequirements.imageMipTailOffset + layerNdx * aspectRequirements.imageMipTailStride);

				deviceMemUniquePtrVec.push_back(makeVkSharedPtr(Move<VkDeviceMemory>(check<VkDeviceMemory>(imageMipTailMemoryBind.memory), Deleter<VkDeviceMemory>(deviceInterface, getDevice(), DE_NULL))));

				imageMipTailMemoryBinds.push_back(imageMipTailMemoryBind);
			}
		}

		if ((aspectRequirements.formatProperties.flags & VK_SPARSE_IMAGE_FORMAT_SINGLE_MIPTAIL_BIT) && aspectRequirements.imageMipTailFirstLod < imageCreateInfo.mipLevels)
		{
			const VkSparseMemoryBind imageMipTailMemoryBind = makeSparseMemoryBind(deviceInterface, getDevice(),
				aspectRequirements.imageMipTailSize, memoryType, aspectRequirements.imageMipTailOffset);

			deviceMemUniquePtrVec.push_back(makeVkSharedPtr(Move<VkDeviceMemory>(check<VkDeviceMemory>(imageMipTailMemoryBind.memory), Deleter<VkDeviceMemory>(deviceInterface, getDevice(), DE_NULL))));

			imageMipTailMemoryBinds.push_back(imageMipTailMemoryBind);
		}

		VkBindSparseInfo bindSparseInfo =
		{
			VK_STRUCTURE_TYPE_BIND_SPARSE_INFO,			//VkStructureType							sType;
			DE_NULL,									//const void*								pNext;
			0u,											//deUint32									waitSemaphoreCount;
			DE_NULL,									//const VkSemaphore*						pWaitSemaphores;
			0u,											//deUint32									bufferBindCount;
			DE_NULL,									//const VkSparseBufferMemoryBindInfo*		pBufferBinds;
			0u,											//deUint32									imageOpaqueBindCount;
			DE_NULL,									//const VkSparseImageOpaqueMemoryBindInfo*	pImageOpaqueBinds;
			0u,											//deUint32									imageBindCount;
			DE_NULL,									//const VkSparseImageMemoryBindInfo*		pImageBinds;
			1u,											//deUint32									signalSemaphoreCount;
			&imageMemoryBindSemaphore.get()				//const VkSemaphore*						pSignalSemaphores;
		};

		VkSparseImageMemoryBindInfo		  imageResidencyBindInfo;
		VkSparseImageOpaqueMemoryBindInfo imageMipTailBindInfo;

		if (imageResidencyMemoryBinds.size() > 0)
		{
			imageResidencyBindInfo.image		= *sparseImage;
			imageResidencyBindInfo.bindCount	= static_cast<deUint32>(imageResidencyMemoryBinds.size());
			imageResidencyBindInfo.pBinds		= &imageResidencyMemoryBinds[0];

			bindSparseInfo.imageBindCount		= 1u;
			bindSparseInfo.pImageBinds			= &imageResidencyBindInfo;
		}

		if (imageMipTailMemoryBinds.size() > 0)
		{
			imageMipTailBindInfo.image			= *sparseImage;
			imageMipTailBindInfo.bindCount		= static_cast<deUint32>(imageMipTailMemoryBinds.size());
			imageMipTailBindInfo.pBinds			= &imageMipTailMemoryBinds[0];

			bindSparseInfo.imageOpaqueBindCount = 1u;
			bindSparseInfo.pImageOpaqueBinds	= &imageMipTailBindInfo;
		}

		// Submit sparse bind commands for execution
		VK_CHECK(deviceInterface.queueBindSparse(sparseQueue.queueHandle, 1u, &bindSparseInfo, DE_NULL));
	}

	// Create command buffer for compute and transfer oparations
	const Unique<VkCommandPool>	  commandPool(makeCommandPool(deviceInterface, getDevice(), computeQueue.queueFamilyIndex));
	const Unique<VkCommandBuffer> commandBuffer(allocateCommandBuffer(deviceInterface, getDevice(), *commandPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));

	// Start recording commands
	beginCommandBuffer(deviceInterface, *commandBuffer);

	// Create descriptor set layout
	const Unique<VkDescriptorSetLayout> descriptorSetLayout(
		DescriptorSetLayoutBuilder()
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, VK_SHADER_STAGE_COMPUTE_BIT)
		.build(deviceInterface, getDevice()));

	// Create and bind compute pipeline
	const Unique<VkShaderModule>	shaderModule(createShaderModule(deviceInterface, getDevice(), m_context.getBinaryCollection().get("comp"), DE_NULL));
	const Unique<VkPipelineLayout>	pipelineLayout(makePipelineLayout(deviceInterface, getDevice(), *descriptorSetLayout));
	const Unique<VkPipeline>		computePipeline(makeComputePipeline(deviceInterface, getDevice(), *pipelineLayout, *shaderModule));

	deviceInterface.cmdBindPipeline(*commandBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *computePipeline);

	// Create and bind descriptor set
	const Unique<VkDescriptorPool> descriptorPool(
		DescriptorPoolBuilder()
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, 1u)
		.build(deviceInterface, getDevice(), VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u));

	const Unique<VkDescriptorSet>	descriptorSet(makeDescriptorSet(deviceInterface, getDevice(), *descriptorPool, *descriptorSetLayout));

	const VkImageSubresourceRange	subresourceRange = makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, 0u, getNumLayers(m_imageType, m_imageSize));
	const Unique<VkImageView>		imageView(makeImageView(deviceInterface, getDevice(), *sparseImage, mapImageViewType(m_imageType), mapTextureFormat(m_format), subresourceRange));
	const VkDescriptorImageInfo		sparseImageInfo  = makeDescriptorImageInfo(DE_NULL, *imageView, VK_IMAGE_LAYOUT_GENERAL);

	DescriptorSetUpdateBuilder()
		.writeSingle(*descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, &sparseImageInfo)
		.update(deviceInterface, getDevice());

	deviceInterface.cmdBindDescriptorSets(*commandBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *pipelineLayout, 0u, 1u, &descriptorSet.get(), 0u, DE_NULL);

	{
		const VkImageMemoryBarrier sparseImageLayoutChangeBarrier = makeImageMemoryBarrier
		(
			0u,
			VK_ACCESS_SHADER_WRITE_BIT,
			VK_IMAGE_LAYOUT_UNDEFINED,
			VK_IMAGE_LAYOUT_GENERAL,
			sparseQueue.queueFamilyIndex != computeQueue.queueFamilyIndex ? sparseQueue.queueFamilyIndex : VK_QUEUE_FAMILY_IGNORED,
			sparseQueue.queueFamilyIndex != computeQueue.queueFamilyIndex ? computeQueue.queueFamilyIndex : VK_QUEUE_FAMILY_IGNORED,
			*sparseImage,
			subresourceRange
		);

		deviceInterface.cmdPipelineBarrier(*commandBuffer, VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, 0u, 0u, DE_NULL, 0u, DE_NULL, 1u, &sparseImageLayoutChangeBarrier);
	}

	const tcu::UVec3  gridSize = getShaderGridSize(m_imageType, m_imageSize);

	{
		const tcu::UVec3  workGroupSize = computeWorkGroupSize(gridSize);

		const deUint32 xWorkGroupCount = gridSize.x() / workGroupSize.x() + (gridSize.x() % workGroupSize.x() ? 1u : 0u);
		const deUint32 yWorkGroupCount = gridSize.y() / workGroupSize.y() + (gridSize.y() % workGroupSize.y() ? 1u : 0u);
		const deUint32 zWorkGroupCount = gridSize.z() / workGroupSize.z() + (gridSize.z() % workGroupSize.z() ? 1u : 0u);

		const tcu::UVec3 maxComputeWorkGroupCount = tcu::UVec3(65535u, 65535u, 65535u);

		if (maxComputeWorkGroupCount.x() < xWorkGroupCount ||
			maxComputeWorkGroupCount.y() < yWorkGroupCount ||
			maxComputeWorkGroupCount.z() < zWorkGroupCount)
		{
			TCU_THROW(NotSupportedError, "Image size is not supported");
		}

		deviceInterface.cmdDispatch(*commandBuffer, xWorkGroupCount, yWorkGroupCount, zWorkGroupCount);
	}

	{
		const VkImageMemoryBarrier sparseImageTrasferBarrier = makeImageMemoryBarrier
		(
			VK_ACCESS_SHADER_WRITE_BIT,
			VK_ACCESS_TRANSFER_READ_BIT,
			VK_IMAGE_LAYOUT_GENERAL,
			VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
			*sparseImage,
			subresourceRange
		);

		deviceInterface.cmdPipelineBarrier(*commandBuffer, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, 0u, 0u, DE_NULL, 0u, DE_NULL, 1u, &sparseImageTrasferBarrier);
	}

	const deUint32					imageSizeInBytes		= getNumPixels(m_imageType, m_imageSize) * tcu::getPixelSize(m_format);
	const VkBufferCreateInfo		outputBufferCreateInfo	= makeBufferCreateInfo(imageSizeInBytes, VK_BUFFER_USAGE_TRANSFER_DST_BIT);
	const Unique<VkBuffer>			outputBuffer			(createBuffer(deviceInterface, getDevice(), &outputBufferCreateInfo));
	const de::UniquePtr<Allocation>	outputBufferAlloc		(bindBuffer(deviceInterface, getDevice(), getAllocator(), *outputBuffer, MemoryRequirement::HostVisible));

	{
		const VkBufferImageCopy bufferImageCopy = makeBufferImageCopy(imageCreateInfo.extent, imageCreateInfo.arrayLayers);

		deviceInterface.cmdCopyImageToBuffer(*commandBuffer, *sparseImage, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, *outputBuffer, 1u, &bufferImageCopy);
	}

	{
		const VkBufferMemoryBarrier outputBufferHostReadBarrier = makeBufferMemoryBarrier
		(
			VK_ACCESS_TRANSFER_WRITE_BIT,
			VK_ACCESS_HOST_READ_BIT,
			*outputBuffer,
			0u,
			imageSizeInBytes
		);

		deviceInterface.cmdPipelineBarrier(*commandBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_HOST_BIT, 0u, 0u, DE_NULL, 1u, &outputBufferHostReadBarrier, 0u, DE_NULL);
	}

	// End recording commands
	endCommandBuffer(deviceInterface, *commandBuffer);

	// The stage at which execution is going to wait for finish of sparse binding operations
	const VkPipelineStageFlags stageBits[] = { VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT };

	// Submit commands for execution and wait for completion
	submitCommandsAndWait(deviceInterface, getDevice(), computeQueue.queueHandle, *commandBuffer, 1u, &imageMemoryBindSemaphore.get(), stageBits);

	// Retrieve data from buffer to host memory
	invalidateMappedMemoryRange(deviceInterface, getDevice(), outputBufferAlloc->getMemory(), outputBufferAlloc->getOffset(), imageSizeInBytes);

	const deUint8* outputData = static_cast<const deUint8*>(outputBufferAlloc->getHostPtr());
	const tcu::ConstPixelBufferAccess pixelBuffer = tcu::ConstPixelBufferAccess(m_format, gridSize.x(), gridSize.y(), gridSize.z(), outputData);

	// Wait for sparse queue to become idle
	deviceInterface.queueWaitIdle(sparseQueue.queueHandle);

	// Validate results
	if( aspectRequirements.imageMipTailFirstLod > 0u )
	{
		const VkExtent3D		 mipExtent		 = mipLevelExtents(imageCreateInfo.extent, 0u);
		const tcu::UVec3		 numSparseBinds  = alignedDivide(mipExtent, imageGranularity);
		const tcu::UVec3		 lastBlockExtent = tcu::UVec3(	mipExtent.width  % imageGranularity.width  ? mipExtent.width  % imageGranularity.width  : imageGranularity.width,
																mipExtent.height % imageGranularity.height ? mipExtent.height % imageGranularity.height : imageGranularity.height,
																mipExtent.depth  % imageGranularity.depth  ? mipExtent.depth  % imageGranularity.depth  : imageGranularity.depth);

		for (deUint32 layerNdx = 0; layerNdx < imageCreateInfo.arrayLayers; ++layerNdx)
		{
			for (deUint32 z = 0; z < numSparseBinds.z(); ++z)
			for (deUint32 y = 0; y < numSparseBinds.y(); ++y)
			for (deUint32 x = 0; x < numSparseBinds.x(); ++x)
			{
				VkExtent3D offset;
				offset.width  = x*imageGranularity.width;
				offset.height = y*imageGranularity.height;
				offset.depth  = z*imageGranularity.depth + layerNdx*numSparseBinds.z()*imageGranularity.depth;

				VkExtent3D extent;
				extent.width  = (x == numSparseBinds.x() - 1) ? lastBlockExtent.x() : imageGranularity.width;
				extent.height = (y == numSparseBinds.y() - 1) ? lastBlockExtent.y() : imageGranularity.height;
				extent.depth  = (z == numSparseBinds.z() - 1) ? lastBlockExtent.z() : imageGranularity.depth;

				const deUint32 linearIndex = x + y*numSparseBinds.x() + z*numSparseBinds.x()*numSparseBinds.y() + layerNdx*numSparseBinds.x()*numSparseBinds.y()*numSparseBinds.z();

				if (linearIndex % 2u == 0u)
				{
					for (deUint32 offsetZ = offset.depth;  offsetZ < offset.depth  + extent.depth;  ++offsetZ)
					for (deUint32 offsetY = offset.height; offsetY < offset.height + extent.height; ++offsetY)
					for (deUint32 offsetX = offset.width;  offsetX < offset.width  + extent.width;  ++offsetX)
					{
						const tcu::UVec4 referenceValue = tcu::UVec4(offsetX % 127u, offsetY % 127u, offsetZ % 127u, 1u);
						const tcu::UVec4 outputValue	= pixelBuffer.getPixelUint(offsetX, offsetY, offsetZ);

						if (deMemCmp(&outputValue, &referenceValue, sizeof(deUint32) * getNumUsedChannels(m_format.order)) != 0)
							return tcu::TestStatus::fail("Failed");
					}
				}
				else if (physicalDeviceProperties.sparseProperties.residencyNonResidentStrict)
				{
					for (deUint32 offsetZ = offset.depth;  offsetZ < offset.depth  + extent.depth;  ++offsetZ)
					for (deUint32 offsetY = offset.height; offsetY < offset.height + extent.height; ++offsetY)
					for (deUint32 offsetX = offset.width;  offsetX < offset.width  + extent.width;  ++offsetX)
					{
						const tcu::UVec4 referenceValue = tcu::UVec4(0u, 0u, 0u, 0u);
						const tcu::UVec4 outputValue = pixelBuffer.getPixelUint(offsetX, offsetY, offsetZ);

						if (deMemCmp(&outputValue, &referenceValue, sizeof(deUint32) * getNumUsedChannels(m_format.order)) != 0)
							return tcu::TestStatus::fail("Failed");
					}
				}
			}
		}
	}
	else
	{
		const VkExtent3D mipExtent = mipLevelExtents(imageCreateInfo.extent, 0u);

		for (deUint32 offsetZ = 0u; offsetZ < mipExtent.depth * imageCreateInfo.arrayLayers; ++offsetZ)
		for (deUint32 offsetY = 0u; offsetY < mipExtent.height; ++offsetY)
		for (deUint32 offsetX = 0u; offsetX < mipExtent.width;  ++offsetX)
		{
			const tcu::UVec4 referenceValue = tcu::UVec4(offsetX % 127u, offsetY % 127u, offsetZ % 127u, 1u);
			const tcu::UVec4 outputValue	= pixelBuffer.getPixelUint(offsetX, offsetY, offsetZ);

			if (deMemCmp(&outputValue, &referenceValue, sizeof(deUint32) * getNumUsedChannels(m_format.order)) != 0)
				return tcu::TestStatus::fail("Failed");
		}
	}

	return tcu::TestStatus::pass("Passed");
}